

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biasmultiply.cc
# Opt level: O2

duration<double,_std::ratio<1L,_1L>_>
testOld_nobias<intgemm::AVX512VNNI::Kernels8>(Index A_rows,Index width,Index B_cols)

{
  UnquantizeAndWrite callback;
  float *pfVar1;
  float *pfVar2;
  long lVar3;
  long lVar4;
  result_type_conflict rVar5;
  double dVar6;
  undefined8 in_stack_ffffffffffffebd8;
  uint uVar7;
  undefined4 in_stack_ffffffffffffebe4;
  AlignedVector<float> B;
  AlignedVector<float> A;
  AlignedVector<signed_char> B_prep;
  AlignedVector<signed_char> A_prep;
  AlignedVector<float> test_C;
  param_type local_13c0;
  mt19937 gen;
  
  intgemm::AlignedVector<float>::AlignedVector(&A,(ulong)(width * A_rows),0x40);
  intgemm::AlignedVector<float>::AlignedVector(&B,(ulong)(B_cols * width),0x40);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(&gen);
  pfVar2 = A.mem_;
  local_13c0._M_a = -1.0;
  local_13c0._M_b = 1.0;
  lVar3 = A.size_ << 2;
  for (lVar4 = 0; pfVar1 = B.mem_, lVar3 != lVar4; lVar4 = lVar4 + 4) {
    rVar5 = std::uniform_real_distribution<float>::operator()
                      ((uniform_real_distribution<float> *)&local_13c0,&gen);
    *(result_type_conflict *)((long)pfVar2 + lVar4) = rVar5;
  }
  lVar3 = B.size_ << 2;
  for (lVar4 = 0; lVar3 != lVar4; lVar4 = lVar4 + 4) {
    rVar5 = std::uniform_real_distribution<float>::operator()
                      ((uniform_real_distribution<float> *)&local_13c0,&gen);
    *(result_type_conflict *)((long)pfVar1 + lVar4) = rVar5;
  }
  intgemm::AlignedVector<signed_char>::AlignedVector(&A_prep,A.size_,0x40);
  intgemm::AlignedVector<signed_char>::AlignedVector(&B_prep,B.size_,0x40);
  intgemm::AVX512BW::Kernels8::PrepareA(A.mem_,A_prep.mem_,63.5,A_rows,width);
  intgemm::AVX512BW::Kernels8::PrepareB(B.mem_,B_prep.mem_,63.5,width,B_cols);
  uVar7 = A_rows;
  intgemm::AlignedVector<float>::AlignedVector(&test_C,(ulong)(B_cols * A_rows),0x40);
  lVar3 = std::chrono::_V2::system_clock::now();
  callback.output_addr._0_4_ = uVar7;
  callback._0_8_ = in_stack_ffffffffffffebd8;
  callback.output_addr._4_4_ = in_stack_ffffffffffffebe4;
  intgemm::AVX512VNNI::Kernels8::Multiply<intgemm::callbacks::UnquantizeAndWrite>
            ((Kernels8 *)A_prep.mem_,B_prep.mem_,(int8_t *)(ulong)A_rows,width,B_cols,
             (Index)test_C.mem_,callback);
  lVar4 = std::chrono::_V2::system_clock::now();
  dVar6 = (double)(lVar4 - lVar3) / 1000000000.0;
  free(test_C.mem_);
  free(B_prep.mem_);
  free(A_prep.mem_);
  free(B.mem_);
  free(A.mem_);
  return (duration<double,_std::ratio<1L,_1L>_>)dVar6;
}

Assistant:

std::chrono::duration<double> testOld_nobias(Index A_rows, Index width, Index B_cols) {
  AlignedVector<float> A(A_rows * width);
  AlignedVector<float> B(width * B_cols);
  std::mt19937 gen;
  std::uniform_real_distribution<float> dist(-1.0f, 1.0f);
  for (auto& it : A) {
    it = dist(gen);
  }
  for (auto& it : B) {
    it = dist(gen);
  }

  float alpha = 2.0f;
  float quant_mult = 127.0f / alpha;
  float unquant_mult = 1.0f / (quant_mult*quant_mult);

  AlignedVector<int8_t> A_prep(A.size());
  AlignedVector<int8_t> B_prep(B.size());
  Routine::PrepareA(A.begin(), A_prep.begin(), quant_mult, A_rows, width);
  Routine::PrepareB(B.begin(), B_prep.begin(), quant_mult, width, B_cols);

  AlignedVector<float> test_C(A_rows * B_cols);

  auto start = std::chrono::system_clock::now();
  Routine::Multiply(A_prep.begin(), B_prep.begin(), A_rows, width, B_cols, callbacks::UnquantizeAndWrite(unquant_mult, test_C.begin()));
  auto end = std::chrono::system_clock::now();

  std::chrono::duration<double> elapsed_seconds = end-start;
  return elapsed_seconds;

}